

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

btScalar AreaOf(btVector3 *x0,btVector3 *x1,btVector3 *x2)

{
  btScalar bVar1;
  btScalar area;
  btVector3 cr;
  btVector3 b;
  btVector3 a;
  btVector3 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb8 [16];
  
  operator-(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_);
  operator-(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_);
  btCross((btVector3 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
          in_stack_ffffffffffffffa8);
  bVar1 = btVector3::length((btVector3 *)0x26a57e);
  return bVar1;
}

Assistant:

static inline btScalar			AreaOf(		const btVector3& x0,
									   const btVector3& x1,
									   const btVector3& x2)
{
	const btVector3	a=x1-x0;
	const btVector3	b=x2-x0;
	const btVector3	cr=btCross(a,b);
	const btScalar	area=cr.length();
	return(area);
}